

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_2::InMemoryEnv::NewWritableFile
          (InMemoryEnv *this,string *fname,WritableFile **result)

{
  long lVar1;
  bool bVar2;
  void *pvVar3;
  undefined8 *in_RCX;
  char *in_RDI;
  long in_FS_OFFSET;
  FileState *file;
  iterator it;
  MutexLock lock;
  FileState *in_stack_ffffffffffffff58;
  FileState *in_stack_ffffffffffffff60;
  _Self *in_stack_ffffffffffffff68;
  mapped_type in_stack_ffffffffffffff70;
  key_type *in_stack_ffffffffffffff78;
  mapped_type this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MutexLock::MutexLock((MutexLock *)in_stack_ffffffffffffff58,(Mutex *)0x18d612b);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
  ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
          *)in_stack_ffffffffffffff60,(key_type *)in_stack_ffffffffffffff58);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
         *)in_stack_ffffffffffffff60);
  bVar2 = std::operator==(in_stack_ffffffffffffff68,(_Self *)in_stack_ffffffffffffff60);
  if (bVar2) {
    in_stack_ffffffffffffff70 = (mapped_type)operator_new(0x78);
    FileState::FileState(in_stack_ffffffffffffff58);
    this_00 = in_stack_ffffffffffffff70;
    FileState::Ref(in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff78 =
         (key_type *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
                       *)this_00,in_stack_ffffffffffffff78);
    (in_stack_ffffffffffffff78->_M_dataplus)._M_p = (pointer)in_stack_ffffffffffffff70;
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>
                  *)in_stack_ffffffffffffff58);
    FileState::Truncate(in_stack_ffffffffffffff70);
  }
  pvVar3 = operator_new(0x10);
  WritableFileImpl::WritableFileImpl
            ((WritableFileImpl *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  *in_RCX = pvVar3;
  Status::OK();
  MutexLock::~MutexLock((MutexLock *)in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status NewWritableFile(const std::string& fname,
                         WritableFile** result) override {
    MutexLock lock(&mutex_);
    FileSystem::iterator it = file_map_.find(fname);

    FileState* file;
    if (it == file_map_.end()) {
      // File is not currently open.
      file = new FileState();
      file->Ref();
      file_map_[fname] = file;
    } else {
      file = it->second;
      file->Truncate();
    }

    *result = new WritableFileImpl(file);
    return Status::OK();
  }